

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall MarrayTest::reshapeTest(MarrayTest *this)

{
  reference pvVar1;
  iterator iVar2;
  iterator iVar3;
  size_t sVar4;
  bool local_361;
  bool local_321;
  bool local_2e9;
  bool local_2b1;
  bool local_279;
  unsigned_long *local_278;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_270;
  allocator<int> local_265;
  CoordinateOrder local_264;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_260;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_258;
  undefined1 local_250 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_3;
  undefined1 local_200 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  allocator<int> local_1c9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c0;
  undefined1 local_1b8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_2;
  undefined1 local_168 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  allocator<int> local_135;
  CoordinateOrder local_134;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  undefined1 local_120 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  allocator<int> local_99;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  undefined1 local_88 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  MarrayTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar1 = 6;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar1 = 4;
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_98._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  std::allocator<int>::allocator(&local_99);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_88,local_90,local_98,&this->scalar_,
             &andres::defaultOrder,&local_99);
  std::allocator<int>::~allocator(&local_99);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar1 = 4;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar1 = 6;
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_88,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar2._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88,0);
  local_2b1 = false;
  if (sVar4 == 4) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88,1);
    local_2b1 = sVar4 == 6;
  }
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_2b1;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_1.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,2,
             (allocator_type *)&m_1.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_1.field_0x47);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,0);
  *pvVar1 = 6;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,1);
  *pvVar1 = 4;
  local_128._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  local_130._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  local_134 = FirstMajorOrder;
  std::allocator<int>::allocator(&local_135);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_120,local_128,local_130,
             &this->scalar_,&local_134,&local_135);
  std::allocator<int>::~allocator(&local_135);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,0);
  *pvVar1 = 4;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,1);
  *pvVar1 = 6;
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_120,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar2._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_120,0);
  local_2e9 = false;
  if (sVar4 == 4) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_120,1);
    local_2e9 = sVar4 == 6;
  }
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_2e9;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_120);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,3,
             (allocator_type *)&m_2.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,0);
  *pvVar1 = 3;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,1);
  *pvVar1 = 4;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,2);
  *pvVar1 = 2;
  local_1c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  local_1c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  std::allocator<int>::allocator(&local_1c9);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1b8,local_1c0,local_1c8,
             &this->scalar_,&andres::defaultOrder,&local_1c9);
  std::allocator<int>::~allocator(&local_1c9);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,0);
  *pvVar1 = 2;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,1);
  *pvVar1 = 3;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,2);
  *pvVar1 = 4;
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_1b8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar2._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1b8,0);
  local_321 = false;
  if (sVar4 == 2) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1b8,1);
    local_321 = false;
    if (sVar4 == 3) {
      sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1b8,2);
      local_321 = sVar4 == 4;
    }
  }
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_321;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,3,
             (allocator_type *)&m_3.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,0);
  *pvVar1 = 3;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,1);
  *pvVar1 = 4;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,2);
  *pvVar1 = 2;
  local_258._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
  local_260._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
  local_264 = FirstMajorOrder;
  std::allocator<int>::allocator(&local_265);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_250,local_258,local_260,
             &this->scalar_,&local_264,&local_265);
  std::allocator<int>::~allocator(&local_265);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,0);
  *pvVar1 = 2;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,1);
  *pvVar1 = 3;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200,2);
  *pvVar1 = 4;
  local_270._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
  local_278 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
  andres::View<int,false,std::allocator<unsigned_long>>::
  reshape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_250,local_270,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_278);
  sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_250,0);
  local_361 = false;
  if (sVar4 == 2) {
    sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_250,1);
    local_361 = false;
    if (sVar4 == 3) {
      sVar4 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_250,2);
      local_361 = sVar4 == 4;
    }
  }
  local_279 = local_361;
  test(&local_279);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_250);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_200);
  return;
}

Assistant:

void MarrayTest::reshapeTest() {
    // 2D 
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    {
        std::vector<std::size_t> shape(2); 
        shape[0] = 6; 
        shape[1] = 4;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 4; 
        shape[1] = 6; 
        m.reshape(shape.begin(), shape.end());

        test(m.shape(0)==4 &&
               m.shape(1)==6);
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4; 
        shape[2] = 2;
        andres::Marray<int> m(shape.begin(), shape.end(), scalar_, andres::FirstMajorOrder);
        shape[0] = 2;
        shape[1] = 3; 
        shape[2] = 4;
        m.reshape(shape.begin(), shape.end());
    
        test(m.shape(0)==2 &&
               m.shape(1)==3 &&
               m.shape(2)==4);
    }
}